

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanCommandBuffer::DispatchIndirect
          (VulkanCommandBuffer *this,VkBuffer Buffer,VkDeviceSize Offset)

{
  char (*in_RCX) [32];
  string msg;
  string local_40;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DispatchIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x117);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (((this->m_State).RenderPass != (VkRenderPass)0x0) ||
     ((this->m_State).DynamicRenderingHash != 0)) {
    Diligent::FormatString<char[168]>
              (&local_40,
               (char (*) [168])
               "vkCmdDispatchIndirect() must be called outside of render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDispatchIndirect-renderpass)"
              );
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DispatchIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x11a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_State).ComputePipeline == (VkPipeline)0x0) {
    Diligent::FormatString<char[26]>(&local_40,(char (*) [26])"No compute pipeline bound");
    Diligent::DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DispatchIndirect",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x11b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  FlushBarriers(this);
  (*vkCmdDispatchIndirect)(this->m_VkCmdBuffer,Buffer,Offset);
  return;
}

Assistant:

__forceinline void DispatchIndirect(VkBuffer Buffer, VkDeviceSize Offset)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(!IsInRenderScope(),
               "vkCmdDispatchIndirect() must be called outside of render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdDispatchIndirect-renderpass)");
        VERIFY(m_State.ComputePipeline != VK_NULL_HANDLE, "No compute pipeline bound");

        FlushBarriers();
        vkCmdDispatchIndirect(m_VkCmdBuffer, Buffer, Offset);
    }